

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Valuator.cxx
# Opt level: O2

void __thiscall Fl_Valuator::Fl_Valuator(Fl_Valuator *this,int X,int Y,int W,int H,char *L)

{
  Fl_Widget::Fl_Widget(&this->super_Fl_Widget,X,Y,W,H,L);
  (this->super_Fl_Widget)._vptr_Fl_Widget = (_func_int **)&PTR__Fl_Widget_00279cc8;
  (this->super_Fl_Widget).label_.align_ = 2;
  (this->super_Fl_Widget).when_ = '\x01';
  *(undefined4 *)&this->value_ = 0;
  *(undefined4 *)((long)&this->value_ + 4) = 0;
  *(undefined4 *)&this->previous_value_ = 0;
  *(undefined4 *)((long)&this->previous_value_ + 4) = 0x3ff00000;
  *(undefined4 *)&this->min = 0;
  *(undefined4 *)((long)&this->min + 4) = 0;
  *(undefined4 *)&this->max = 0;
  *(undefined4 *)((long)&this->max + 4) = 0x3ff00000;
  this->A = 0.0;
  this->B = 1;
  return;
}

Assistant:

Fl_Valuator::Fl_Valuator(int X, int Y, int W, int H, const char* L)
/**
  Creates a new Fl_Valuator widget using the given position,
  size, and label string. The default boxtype is FL_NO_BOX.
*/
: Fl_Widget(X,Y,W,H,L) {
  align(FL_ALIGN_BOTTOM);
  when(FL_WHEN_CHANGED);
  value_ = 0;
  previous_value_ = 1;
  min = 0;
  max = 1;
  A = 0.0;
  B = 1;
}